

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_psbt.cpp
# Opt level: O1

int CfdCreatePsbtHandle(void *handle,int net_type,char *psbt_string,char *tx_hex_string,
                       uint32_t version,uint32_t locktime,void **psbt_handle)

{
  _func_int **pp_Var1;
  Transaction *pTVar2;
  bool bVar3;
  NetType NVar4;
  void *pvVar5;
  Psbt *this;
  CfdException *pCVar6;
  bool is_bitcoin;
  string err_msg;
  Psbt psbt;
  bool local_1b2 [2];
  void *local_1b0;
  undefined1 local_1a8 [32];
  Psbt local_188;
  allocator local_108 [24];
  Transaction local_f0;
  Psbt local_b0;
  
  local_1b0 = handle;
  cfd::Initialize();
  if (psbt_handle == (void **)0x0) {
    local_b0.super_Psbt._vptr_Psbt = (_func_int **)0x5f58da;
    local_b0.super_Psbt.wally_psbt_pointer_._0_4_ = 0x110;
    local_b0.super_Psbt.base_tx_.super_AbstractTransaction._vptr_AbstractTransaction =
         (_func_int **)0x5f58eb;
    cfd::core::logger::log<>
              ((CfdSourceLocation *)&local_b0,kCfdLogLevelWarning,"psbt_handle is null.");
    pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
    local_b0.super_Psbt._vptr_Psbt = (_func_int **)&local_b0.super_Psbt.base_tx_;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_b0,"Failed to parameter. psbt_handle is null.","");
    cfd::core::CfdException::CfdException(pCVar6,kCfdIllegalArgumentError,(string *)&local_b0);
    __cxa_throw(pCVar6,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  local_1b2[0] = false;
  NVar4 = cfd::capi::ConvertNetType(net_type,local_1b2);
  if (local_1b2[0] == false) {
    pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
    local_b0.super_Psbt._vptr_Psbt = (_func_int **)&local_b0.super_Psbt.base_tx_;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_b0,"Elements is not supported.","");
    cfd::core::CfdException::CfdException(pCVar6,kCfdIllegalArgumentError,(string *)&local_b0);
    __cxa_throw(pCVar6,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  cfd::Psbt::Psbt(&local_b0);
  bVar3 = cfd::capi::IsEmptyString(psbt_string);
  if (bVar3) {
    bVar3 = cfd::capi::IsEmptyString(tx_hex_string);
    if (bVar3) {
      cfd::Psbt::Psbt((Psbt *)(local_1a8 + 0x20),version,locktime);
      cfd::Psbt::operator=(&local_b0,(Psbt *)(local_1a8 + 0x20));
      local_188.super_Psbt._vptr_Psbt = (_func_int **)&PTR__Psbt_00739740;
      std::
      _Rb_tree<cfd::core::OutPoint,_cfd::core::OutPoint,_std::_Identity<cfd::core::OutPoint>,_std::less<cfd::core::OutPoint>,_std::allocator<cfd::core::OutPoint>_>
      ::~_Rb_tree(&local_188.verify_ignore_map_._M_t);
      cfd::core::Psbt::~Psbt((Psbt *)(local_1a8 + 0x20));
      goto LAB_0041ca6d;
    }
    std::__cxx11::string::string((string *)local_1a8,tx_hex_string,local_108);
    cfd::core::Transaction::Transaction(&local_f0,(string *)local_1a8);
    cfd::Psbt::Psbt((Psbt *)(local_1a8 + 0x20),&local_f0);
    cfd::Psbt::operator=(&local_b0,(Psbt *)(local_1a8 + 0x20));
    local_188.super_Psbt._vptr_Psbt = (_func_int **)&PTR__Psbt_00739740;
    std::
    _Rb_tree<cfd::core::OutPoint,_cfd::core::OutPoint,_std::_Identity<cfd::core::OutPoint>,_std::less<cfd::core::OutPoint>,_std::allocator<cfd::core::OutPoint>_>
    ::~_Rb_tree(&local_188.verify_ignore_map_._M_t);
    cfd::core::Psbt::~Psbt((Psbt *)(local_1a8 + 0x20));
    cfd::core::Transaction::~Transaction(&local_f0);
    pTVar2 = (Transaction *)local_1a8;
  }
  else {
    std::__cxx11::string::string((string *)&local_f0,psbt_string,(allocator *)local_1a8);
    cfd::Psbt::Psbt((Psbt *)(local_1a8 + 0x20),(string *)&local_f0);
    cfd::Psbt::operator=(&local_b0,(Psbt *)(local_1a8 + 0x20));
    local_188.super_Psbt._vptr_Psbt = (_func_int **)&PTR__Psbt_00739740;
    std::
    _Rb_tree<cfd::core::OutPoint,_cfd::core::OutPoint,_std::_Identity<cfd::core::OutPoint>,_std::less<cfd::core::OutPoint>,_std::allocator<cfd::core::OutPoint>_>
    ::~_Rb_tree(&local_188.verify_ignore_map_._M_t);
    cfd::core::Psbt::~Psbt((Psbt *)(local_1a8 + 0x20));
    pTVar2 = &local_f0;
  }
  pp_Var1 = (pTVar2->super_AbstractTransaction)._vptr_AbstractTransaction;
  if ((vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_> *)pp_Var1 != &pTVar2->vin_) {
    operator_delete(pp_Var1);
  }
LAB_0041ca6d:
  pTVar2 = (Transaction *)((long)&local_188.super_Psbt + 0x10);
  local_188.super_Psbt._vptr_Psbt = (_func_int **)pTVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_1a8 + 0x20),"PsbtHandle","");
  pvVar5 = cfd::capi::AllocBuffer((string *)(local_1a8 + 0x20),0x20);
  if ((Transaction *)local_188.super_Psbt._vptr_Psbt != pTVar2) {
    operator_delete(local_188.super_Psbt._vptr_Psbt);
  }
  this = (Psbt *)operator_new(0x80);
  cfd::Psbt::Psbt(this,&local_b0);
  *(Psbt **)((long)pvVar5 + 0x18) = this;
  *(NetType *)((long)pvVar5 + 0x10) = NVar4;
  *psbt_handle = pvVar5;
  local_b0.super_Psbt._vptr_Psbt = (_func_int **)&PTR__Psbt_00739740;
  std::
  _Rb_tree<cfd::core::OutPoint,_cfd::core::OutPoint,_std::_Identity<cfd::core::OutPoint>,_std::less<cfd::core::OutPoint>,_std::allocator<cfd::core::OutPoint>_>
  ::~_Rb_tree(&local_b0.verify_ignore_map_._M_t);
  cfd::core::Psbt::~Psbt(&local_b0.super_Psbt);
  return 0;
}

Assistant:

int CfdCreatePsbtHandle(
    void* handle, int net_type, const char* psbt_string,
    const char* tx_hex_string, uint32_t version, uint32_t locktime,
    void** psbt_handle) {
  int result = CfdErrorCode::kCfdUnknownError;
  CfdCapiPsbtHandle* buffer = nullptr;
  try {
    cfd::Initialize();

    if (psbt_handle == nullptr) {
      warn(CFD_LOG_SOURCE, "psbt_handle is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. psbt_handle is null.");
    }
    bool is_bitcoin = false;
    NetType network_type = ConvertNetType(net_type, &is_bitcoin);
    if (!is_bitcoin) {
      throw CfdException(
          CfdError::kCfdIllegalArgumentError, "Elements is not supported.");
    }

    Psbt psbt;
    if (!IsEmptyString(psbt_string)) {
      try {
        psbt = Psbt(psbt_string);
      } catch (const CfdException& fail_base64) {
        std::string err_msg(fail_base64.what());
        if (err_msg != "psbt unmatch magic error.") {
          throw fail_base64;
        }
        psbt = Psbt(ByteData(psbt_string));
      }
    } else if (!IsEmptyString(tx_hex_string)) {
      psbt = Psbt(Transaction(tx_hex_string));
    } else {
      psbt = Psbt(version, locktime);
    }

    buffer = static_cast<CfdCapiPsbtHandle*>(
        AllocBuffer(kPrefixPsbtHandle, sizeof(CfdCapiPsbtHandle)));
    buffer->psbt = new Psbt(psbt);
    buffer->net_type = network_type;
    *psbt_handle = buffer;
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  CfdFreePsbtHandle(handle, buffer);
  return result;
}